

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void traverse_hplane<PredictionData<float,long>,long,ImputedData<long,long_double>>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               PredictionData<float,_long> *prediction_data,double *output_depth,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *impute_nodes,
               ImputedData<long,_long_double> *imputed_data,long *tree_num,double *tree_depth,
               size_t row)

{
  int iVar1;
  pointer pIVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  size_t *psVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double local_a8;
  
  if (prediction_data->Xr_indptr == (long *)0x0) {
    if (prediction_data->Xc_indptr == (long *)0x0) {
      uVar8 = (uint)prediction_data->is_col_major;
    }
    else {
      uVar8 = 3;
    }
  }
  else {
    uVar8 = 2;
  }
  local_a8 = *output_depth;
  pIVar2 = (hplane->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (sVar7 = 0; pIVar2[sVar7].hplane_left != 0;
      sVar7 = (&pIVar2[sVar7].hplane_left)[pIVar2[sVar7].split_point < dVar14]) {
    dVar14 = 0.0;
    lVar11 = 0;
    for (uVar12 = 0;
        lVar3 = *(long *)&pIVar2[sVar7].col_num.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl,
        uVar12 < (ulong)((long)*(pointer *)
                                ((long)&pIVar2[sVar7].col_num.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl + 8) - lVar3 >> 3); uVar12 = uVar12 + 1) {
      iVar1 = *(int *)(*(long *)&pIVar2[sVar7].col_type.
                                 super__Vector_base<ColType,_std::allocator<ColType>_>._M_impl.
                                 super__Vector_impl_data + uVar12 * 4);
      if (iVar1 == 0x20) {
        sVar4 = *(size_t *)(lVar3 + uVar12 * 8);
        psVar10 = &prediction_data->ncols_categ;
        sVar6 = row;
        if (prediction_data->is_col_major != false) {
          psVar10 = &prediction_data->nrows;
          sVar6 = sVar4;
          sVar4 = row;
        }
        iVar1 = prediction_data->categ_data[sVar6 * *psVar10 + sVar4];
        if ((long)iVar1 < 0) {
          if (model_outputs->missing_action == Fail) {
            *output_depth = NAN;
            return;
          }
          dVar14 = dVar14 + *(double *)
                             (*(long *)&pIVar2[sVar7].fill_val.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data + uVar12 * 8);
        }
        else if (model_outputs->cat_split_type == SubSet) {
          lVar3 = *(long *)&pIVar2[sVar7].cat_coef.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          lVar5 = *(long *)(lVar3 + lVar11 * 0x18);
          iVar9 = (int)((ulong)(*(long *)(lVar3 + 8 + lVar11 * 0x18) - lVar5) >> 3);
          if (iVar1 < iVar9) {
            dVar14 = dVar14 + *(double *)(lVar5 + (long)iVar1 * 8);
          }
          else if (model_outputs->new_cat_action == Random) {
            dVar14 = dVar14 + *(double *)(lVar5 + ((long)iVar1 % (long)iVar9 & 0xffffffffU) * 8);
          }
          else {
            dVar14 = dVar14 + *(double *)
                               (*(long *)&pIVar2[sVar7].fill_new.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data + lVar11 * 8);
          }
        }
        else if (model_outputs->cat_split_type == SingleCateg) {
          dVar13 = 0.0;
          if (iVar1 == *(int *)(*(long *)&pIVar2[sVar7].chosen_cat.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + lVar11 * 4)) {
            dVar13 = *(double *)
                      (*(long *)&pIVar2[sVar7].fill_new.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + lVar11 * 8);
          }
          dVar14 = dVar14 + dVar13;
        }
        lVar11 = lVar11 + 1;
      }
      else if (iVar1 == 0x1f) {
        (*(code *)(&DAT_00325668 + *(int *)(&DAT_00325668 + (ulong)uVar8 * 4)))();
        return;
      }
    }
    dVar13 = 1.0;
    if (pIVar2[sVar7].range_low <= dVar14) {
      dVar13 = (double)(-(ulong)(pIVar2[sVar7].range_high < dVar14) & 0x3ff0000000000000);
    }
    local_a8 = local_a8 - dVar13;
    *output_depth = local_a8;
  }
  dVar14 = pIVar2[sVar7].score;
  *output_depth = local_a8 + dVar14;
  if (tree_num != (long *)0x0) {
    tree_num[row] = sVar7;
  }
  if (tree_depth != (double *)0x0) {
    *tree_depth = dVar14;
  }
  if (imputed_data == (ImputedData<long,_long_double> *)0x0) {
    return;
  }
  add_from_impute_node<ImputedData<long,long_double>>
            ((impute_nodes->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start + sVar7,imputed_data,1.0);
  return;
}

Assistant:

void traverse_hplane(std::vector<IsoHPlane>   &hplane,
                     ExtIsoForest             &model_outputs,
                     PredictionData           &prediction_data,
                     double &restrict         output_depth,
                     std::vector<ImputeNode> *impute_nodes,     /* only when imputing missing */
                     ImputedData             *imputed_data,     /* only when imputing missing */
                     sparse_ix *restrict      tree_num,
                     double *restrict         tree_depth,
                     size_t                   row) noexcept
{
    size_t  curr_lev = 0;
    double  xval;
    int     cval;
    double  hval;

    size_t ncols_numeric, ncols_categ;

    NumericConfig numeric_config;
    if (prediction_data.Xr_indptr != NULL)
        numeric_config = SparseCSR;
    else if (prediction_data.Xc_indptr != NULL)
        numeric_config = SparseCSC;
    else if (prediction_data.is_col_major)
        numeric_config = DenseColMajor;
    else
        numeric_config = DenseRowMajor;

    sparse_ix *row_st = NULL, *row_end = NULL;
    size_t lb, ub;
    if (numeric_config == SparseCSR)
    {
        row_st  = prediction_data.Xr_ind + prediction_data.Xr_indptr[row];
        row_end = prediction_data.Xr_ind + prediction_data.Xr_indptr[row + 1];
        lb = *row_st;
        ub = *(row_end-1);
    }

    while (true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            if (unlikely(imputed_data != NULL))
            {
                add_from_impute_node((*impute_nodes)[curr_lev], *imputed_data, (double)1);
            }
            return;
        }

        else
        {
            hval = 0;
            ncols_numeric = 0; ncols_categ = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
            {
                switch(hplane[curr_lev].col_type[col])
                {
                    case Numeric:
                    {
                        switch(numeric_config)
                        {
                            case DenseRowMajor:
                            {
                                xval = prediction_data.numeric_data[hplane[curr_lev].col_num[col] + row * prediction_data.ncols_numeric];
                                break;
                            }

                            case DenseColMajor:
                            {
                                xval = prediction_data.numeric_data[row +  hplane[curr_lev].col_num[col] * prediction_data.nrows];
                                break;
                            }

                            case SparseCSR:
                            {
                                xval = extract_spR(prediction_data, row_st, row_end, hplane[curr_lev].col_num[col], lb, ub);
                                break;
                            }

                            case SparseCSC:
                            {
                                xval = extract_spC(prediction_data, row, hplane[curr_lev].col_num[col]);
                                break;
                            }
                        }

                        if (unlikely(is_na_or_inf(xval)))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }

                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            hval += (xval - hplane[curr_lev].mean[ncols_numeric]) * hplane[curr_lev].coef[ncols_numeric];
                        }

                        ncols_numeric++;
                        break;
                    }

                    case Categorical:
                    {
                        cval = prediction_data.categ_data[
                            prediction_data.is_col_major?
                            (row +  hplane[curr_lev].col_num[col] * prediction_data.nrows)
                                :
                            (hplane[curr_lev].col_num[col] + row * prediction_data.ncols_categ)
                        ];
                        if (unlikely(cval < 0))
                        {
                            if (model_outputs.missing_action != Fail)
                            {
                                hval += hplane[curr_lev].fill_val[col];
                            }
                            
                            else
                            {
                                output_depth = NAN;
                                return;
                            }
                        }

                        else
                        {
                            switch(model_outputs.cat_split_type)
                            {
                                case SingleCateg:
                                {
                                    hval += (cval == hplane[curr_lev].chosen_cat[ncols_categ])? hplane[curr_lev].fill_new[ncols_categ] : 0;
                                    break;
                                }

                                case SubSet:
                                {
                                    if (unlikely(cval >= (int)hplane[curr_lev].cat_coef[ncols_categ].size()))
                                    {
                                        if (model_outputs.new_cat_action == Random) {
                                            cval = cval % (int)hplane[curr_lev].cat_coef[ncols_categ].size();
                                            hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                        }

                                        else {
                                            hval += hplane[curr_lev].fill_new[ncols_categ];
                                        }
                                    }
                                    
                                    else
                                    {
                                        hval += hplane[curr_lev].cat_coef[ncols_categ][cval];
                                    }
                                    
                                    break;
                                }
                            }
                        }

                        ncols_categ++;
                        break;
                    }

                    default:
                    {
                        assert(0);
                        break;
                    }
                }

            }

            output_depth -= (hval < hplane[curr_lev].range_low) ||
                            (hval > hplane[curr_lev].range_high);
            curr_lev       = (hval <= hplane[curr_lev].split_point)?
                             hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;
        }
    }
}